

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O1

void __thiscall google::protobuf::internal::MicroString::ClearSlow(MicroString *this)

{
  size_type sVar1;
  LargeRepKind LVar2;
  MicroRep *pMVar3;
  StringRep *pSVar4;
  LargeRep *pLVar5;
  
  if (((ulong)this->rep_ & 2) == 0) {
    LVar2 = large_rep_kind(this);
    switch(LVar2) {
    case kAlias:
      pLVar5 = large_rep(this);
      *(undefined2 *)&pLVar5->payload = 0xe00;
      this->rep_ = (void *)((long)&pLVar5->payload + 2);
      break;
    case kUnowned:
      this->rep_ = (void *)0x0;
      break;
    case kString:
      pSVar4 = string_rep(this);
      (pSVar4->str)._M_string_length = 0;
      *(pSVar4->str)._M_dataplus._M_p = '\0';
      sVar1 = (pSVar4->str)._M_string_length;
      (pSVar4->super_LargeRep).payload = (pSVar4->str)._M_dataplus._M_p;
      (pSVar4->super_LargeRep).size = (uint32_t)sVar1;
      break;
    case kOwned:
      pLVar5 = large_rep(this);
      LargeRep::owned_head(pLVar5);
      LargeRep::owned_head(pLVar5);
      pLVar5->size = 0;
    }
  }
  else {
    pMVar3 = micro_rep(this);
    pMVar3->size = '\0';
  }
  return;
}

Assistant:

void MicroString::ClearSlow() {
  if (is_micro_rep()) {
    micro_rep()->ChangeSize(0);
    return;
  }

  switch (large_rep_kind()) {
    case kOwned:
      large_rep()->ChangeSize(0);
      return;
    case kString: {
      auto* rep = string_rep();
      rep->str.clear();
      rep->ResetBase();
      return;
    }
    case kAlias: {
      // We have a large rep we can't really use much.
      // Transform it into a micro rep to use the space for something.
      MicroRep* rep = reinterpret_cast<MicroRep*>(large_rep());
      rep->capacity = sizeof(LargeRep) - sizeof(MicroRep);
      rep->SetInitialSize(0);
      rep_ = reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(rep) +
                                     kIsMicroRepTag);
      return;
    }
    case kUnowned:
      // We don't own any memory, so just reset to default.
      InitDefault();
      break;
  }
}